

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinarySearchTree.cpp
# Opt level: O3

bool __thiscall BinarySearchTree::removeElement(BinarySearchTree *this,int value)

{
  Node *child;
  Node *pNVar1;
  Node **ppNVar2;
  Node *loc;
  Node *par;
  
  loc = this->root;
  if (loc == (Node *)0x0) {
    return false;
  }
  if (loc->value == value) {
    par = (Node *)0x0;
  }
  else {
    pNVar1 = (&loc->leftChild)[loc->value <= value];
    par = loc;
    while( true ) {
      loc = pNVar1;
      if (loc == (Node *)0x0) {
        return false;
      }
      if (loc->value == value) break;
      pNVar1 = (&loc->leftChild)[loc->value <= value];
      par = loc;
    }
  }
  pNVar1 = loc->leftChild;
  if (pNVar1 == (Node *)0x0) {
    if (loc->rightChild == (Node *)0x0) {
      ppNVar2 = &this->root;
      if (par != (Node *)0x0) {
        ppNVar2 = &par->rightChild;
        if (par->leftChild == loc) {
          ppNVar2 = &par->leftChild;
        }
      }
      *ppNVar2 = (Node *)0x0;
      pNVar1 = loc->leftChild;
      if (pNVar1 != (Node *)0x0) goto LAB_00105a79;
    }
LAB_00105ad9:
    if (loc->rightChild == (Node *)0x0) goto LAB_00105b13;
    ppNVar2 = &this->root;
    if (par != (Node *)0x0) {
      ppNVar2 = &par->rightChild;
      if (par->leftChild == loc) {
        ppNVar2 = &par->leftChild;
      }
    }
    *ppNVar2 = loc->rightChild;
    if (loc->leftChild == (Node *)0x0) goto LAB_00105b13;
  }
  else {
LAB_00105a79:
    if (loc->rightChild == (Node *)0x0) {
      ppNVar2 = &this->root;
      if (par != (Node *)0x0) {
        ppNVar2 = &par->rightChild;
        if (par->leftChild == loc) {
          ppNVar2 = &par->leftChild;
        }
      }
      *ppNVar2 = pNVar1;
      if (loc->leftChild == (Node *)0x0) goto LAB_00105ad9;
    }
  }
  if (loc->rightChild != (Node *)0x0) {
    caseC(this,par,loc);
  }
LAB_00105b13:
  operator_delete(loc,0x18);
  return true;
}

Assistant:

bool BinarySearchTree::removeElement(int value) {
    Node *parent, *location;
    if (root == nullptr) {
        return false;
    }
    find(value, &parent, &location);
    if (location == nullptr) {
        return false;
    }
    if (location->leftChild == nullptr && location->rightChild == nullptr) {
        caseA(parent, location);
    }
    if (location->leftChild != nullptr && location->rightChild == nullptr) {
        caseB(parent, location);
    }
    if (location->leftChild == nullptr && location->rightChild != nullptr) {
        caseB(parent, location);
    }
    if (location->leftChild != nullptr && location->rightChild != nullptr) {
        caseC(parent, location);
    }
    delete location;
    return true;
}